

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall Board::setFrame(Board *this)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  *(undefined8 *)(this->rows + 0x15) = 0x1fffff00000000;
  this->rows[0] = 0xfff;
  this->cols[0xb] = 0x1fffff;
  lVar5 = 1;
  do {
    piVar1 = this->rows + lVar5;
    piVar1[0] = 0x801;
    piVar1[1] = 0x801;
    piVar1[2] = 0x801;
    auVar4 = _DAT_0011e240;
    auVar3 = _DAT_0011e230;
    auVar2 = _DAT_0011e220;
    piVar1[3] = 0x801;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x15);
  lVar5 = 0;
  do {
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7 = (auVar6 | auVar3) ^ auVar4;
    if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffffff6) {
      this->cols[lVar5 + 1] = 1;
      this->cols[lVar5 + 2] = 1;
    }
    auVar6 = (auVar6 | auVar2) ^ auVar4;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffff6) {
      this->cols[lVar5 + 3] = 1;
      this->cols[lVar5 + 4] = 1;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  return;
}

Assistant:

void Board::setFrame(){
    rows[MAPHEIGHT + 1] = 0;
    rows[0] = FULL_ROW;
    cols[0] = cols[MAPWIDTH + 1] = FULL_COL;
    for (int i = 1; i <= MAPHEIGHT; ++i)
        rows[i] = EMPTY_ROW;
    for (int i = 1; i <= MAPWIDTH; ++i)
        cols[i] = EMPTY_COL;
}